

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O1

Reactor_base * __thiscall
iqxmlrpc::Serial_executor_factory::create_reactor(Serial_executor_factory *this)

{
  Reactor_base *pRVar1;
  
  pRVar1 = (Reactor_base *)operator_new(0x70);
  pRVar1->_vptr_Reactor_base = (_func_int **)&PTR__Reactor_001892e8;
  iqnet::Reactor_poll_impl::Reactor_poll_impl((Reactor_poll_impl *)(pRVar1 + 2));
  *(undefined4 *)&pRVar1[5]._vptr_Reactor_base = 0;
  pRVar1[6]._vptr_Reactor_base = (_func_int **)0x0;
  pRVar1[7]._vptr_Reactor_base = (_func_int **)(pRVar1 + 5);
  pRVar1[8]._vptr_Reactor_base = (_func_int **)(pRVar1 + 5);
  pRVar1[9]._vptr_Reactor_base = (_func_int **)0x0;
  pRVar1[0xb]._vptr_Reactor_base = (_func_int **)(pRVar1 + 10);
  pRVar1[10]._vptr_Reactor_base = (_func_int **)(pRVar1 + 10);
  pRVar1[0xc]._vptr_Reactor_base = (_func_int **)0x0;
  *(undefined4 *)&pRVar1[0xd]._vptr_Reactor_base = 0;
  return pRVar1;
}

Assistant:

iqnet::Reactor_base* Serial_executor_factory::create_reactor()
{
  return new iqnet::Reactor<iqnet::Null_lock>;
}